

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<unsigned_int,_long_double>::Run
          (DataTransform<unsigned_int,_long_double> *this,istream *input_stream)

{
  longdouble lVar1;
  ulong uVar2;
  istream *in_RSI;
  long in_RDI;
  bool bVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  double dVar6;
  ostringstream error_message;
  bool is_clipped;
  longdouble output_data;
  invalid_argument *anon_var_0;
  string word;
  uint input_data;
  int index;
  char buffer [128];
  ostream *in_stack_fffffffffffffcb8;
  undefined2 in_stack_fffffffffffffcc0;
  undefined6 in_stack_fffffffffffffcc2;
  undefined2 in_stack_fffffffffffffcc8;
  undefined6 in_stack_fffffffffffffcca;
  ostringstream *in_stack_fffffffffffffcd8;
  ostream *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined6 in_stack_fffffffffffffcf0;
  undefined2 in_stack_fffffffffffffcf6;
  undefined2 in_stack_fffffffffffffcf8;
  undefined6 uStack_306;
  uint local_298;
  allocator local_289;
  string local_288 [32];
  ostringstream local_268 [272];
  ostringstream *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  longdouble local_e8;
  int local_d0;
  string local_c0 [32];
  uint local_a0;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar3 = sptk::ReadStream<unsigned_int>
                        ((uint *)CONCAT62(in_stack_fffffffffffffcca,in_stack_fffffffffffffcc8),
                         (istream *)CONCAT62(in_stack_fffffffffffffcc2,in_stack_fffffffffffffcc0));
      if (!bVar3) goto LAB_00162c34;
    }
    else {
      in_stack_fffffffffffffcf8 = SUB82(local_c0,0);
      uStack_306 = (undefined6)((ulong)local_c0 >> 0x10);
      std::__cxx11::string::string(local_c0);
      std::operator>>(local_18,(string *)CONCAT62(uStack_306,in_stack_fffffffffffffcf8));
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::stold((string *)CONCAT62(in_stack_fffffffffffffcc2,in_stack_fffffffffffffcc0),
                            (size_t *)in_stack_fffffffffffffcb8);
        in_stack_fffffffffffffcec = SUB104(in_ST0,0);
        in_stack_fffffffffffffcf0 = (undefined6)((unkuint10)in_ST0 >> 0x20);
        local_298 = (uint)(long)ROUND(in_ST0);
        local_a0 = local_298;
        local_d0 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
      }
      else {
        local_d0 = 2;
      }
      std::__cxx11::string::~string(local_c0);
      if (local_d0 != 0) {
        if (local_d0 != 1) {
LAB_00162c34:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_00162c70;
      }
      in_stack_fffffffffffffce8 = 0;
    }
    local_e8 = (longdouble)local_a0;
    bVar3 = false;
    if (*(longdouble *)(in_RDI + 0x40) < *(longdouble *)(in_RDI + 0x50)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)(ulong)local_a0 < (long)ROUND(*(longdouble *)(in_RDI + 0x40))) {
          local_e8 = *(longdouble *)(in_RDI + 0x40);
          bVar3 = true;
        }
        else {
          bVar3 = (long)ROUND(*(longdouble *)(in_RDI + 0x50)) < (long)(ulong)local_a0;
          if (bVar3) {
            local_e8 = *(longdouble *)(in_RDI + 0x50);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        lVar1 = *(longdouble *)(in_RDI + 0x40);
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar1) {
          lVar5 = lVar4;
        }
        in_ST5 = in_ST4;
        if ((ulong)local_a0 < ((long)ROUND(lVar1 - lVar5) ^ (ulong)(lVar4 <= lVar1) << 0x3f)) {
          local_e8 = *(longdouble *)(in_RDI + 0x40);
          bVar3 = true;
        }
        else {
          lVar1 = *(longdouble *)(in_RDI + 0x50);
          lVar4 = (longdouble)9.223372e+18;
          lVar5 = (longdouble)0;
          if (lVar4 <= lVar1) {
            lVar5 = lVar4;
          }
          bVar3 = ((long)ROUND(lVar1 - lVar5) ^ (ulong)(lVar4 <= lVar1) << 0x3f) < (ulong)local_a0;
          if (bVar3) {
            local_e8 = *(longdouble *)(in_RDI + 0x50);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        if (*(longdouble *)(in_RDI + 0x40) <= (longdouble)local_a0) {
          bVar3 = *(longdouble *)(in_RDI + 0x50) < (longdouble)local_a0;
          if (bVar3) {
            local_e8 = *(longdouble *)(in_RDI + 0x50);
          }
        }
        else {
          local_e8 = *(longdouble *)(in_RDI + 0x40);
          bVar3 = true;
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && (!bVar3)) {
      if ((double)local_a0 <= 0.0) {
        dVar6 = (double)local_a0 + -0.5;
      }
      else {
        dVar6 = (double)local_a0 + 0.5;
      }
      local_e8 = (longdouble)dVar6;
    }
    in_ST6 = in_ST5;
    if ((bVar3) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffcd8 = local_268;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffce0 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcd8,local_9c);
      std::operator<<(in_stack_fffffffffffffce0,"th data is over the range of output type");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"x2x",&local_289);
      sptk::PrintErrorMessage(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      bVar3 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar3) {
        local_1 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_268);
      if (bVar3) goto LAB_00162c70;
    }
    in_stack_fffffffffffffcc0 = (undefined2)((unkuint10)local_e8 >> 0x40);
    in_stack_fffffffffffffcb8 = SUB108(local_e8,0);
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar3 = sptk::WriteStream<long_double>
                        ((longdouble)
                         CONCAT28(in_stack_fffffffffffffcc8,
                                  CONCAT62(in_stack_fffffffffffffcc2,in_stack_fffffffffffffcc0)),
                         in_stack_fffffffffffffcb8);
      if (!bVar3) {
        local_1 = 0;
LAB_00162c70:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar3 = sptk::SnPrintf<long_double>
                        ((longdouble)
                         CONCAT28(in_stack_fffffffffffffcf8,
                                  CONCAT26(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                         (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         (size_t)in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
      if (!bVar3) {
        local_1 = 0;
        goto LAB_00162c70;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }